

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O2

double __thiscall FastPForLib::ZipfianGenerator::zeta(ZipfianGenerator *this,int nn,double ttheta)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  for (lVar1 = 1; lVar1 - (ulong)(uint)(~(nn >> 0x1f) & nn) != 1; lVar1 = lVar1 + 1) {
    dVar3 = pow((double)lVar1,ttheta);
    dVar2 = dVar2 + 1.0 / dVar3;
  }
  return dVar2;
}

Assistant:

double zeta(int nn, double ttheta) {
    double sum = 0;
    for (long i = 0; i < nn; i++) {
      sum += 1.0 / (pow(static_cast<double>(i + 1), ttheta));
    }
    return sum;
  }